

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O2

void ktxHashList_Destruct(ktxHashList *pHead)

{
  void *pvVar1;
  ktxHashList pkVar2;
  UT_hash_table *pUVar3;
  long lVar4;
  void *pvVar5;
  UT_hash_bucket *pUVar6;
  UT_hash_handle *pUVar7;
  UT_hash_handle *pUVar8;
  uint uVar9;
  ktxHashList __ptr;
  ktxHashList pkVar10;
  ktxHashList pkVar11;
  
  pkVar10 = *pHead;
  __ptr = pkVar10;
  while (__ptr != (ktxHashList)0x0) {
    pvVar1 = (__ptr->hh).prev;
    pkVar2 = (ktxHashList)(__ptr->hh).next;
    pUVar3 = (pkVar10->hh).tbl;
    if (pkVar2 == (ktxHashList)0x0 && pvVar1 == (void *)0x0) {
      free(pUVar3->buckets);
      free((pkVar10->hh).tbl);
      pkVar10 = (ktxHashList)0x0;
    }
    else {
      lVar4 = pUVar3->hho;
      if (__ptr == (ktxHashList)((long)pUVar3->tail - lVar4)) {
        pUVar3->tail = (UT_hash_handle *)((long)pvVar1 + lVar4);
      }
      pkVar11 = pkVar2;
      if (pvVar1 != (void *)0x0) {
        *(ktxHashList *)((long)pvVar1 + lVar4 + 0x10) = pkVar2;
        pkVar11 = pkVar10;
      }
      pvVar5 = (__ptr->hh).next;
      pUVar3 = (pkVar11->hh).tbl;
      if (pvVar5 != (void *)0x0) {
        *(void **)((long)pvVar5 + pUVar3->hho + 8) = pvVar1;
      }
      uVar9 = pUVar3->num_buckets - 1 & (__ptr->hh).hashv;
      pUVar6 = pUVar3->buckets;
      pUVar6[uVar9].count = pUVar6[uVar9].count - 1;
      if (pUVar6[uVar9].hh_head == &__ptr->hh) {
        pUVar6[uVar9].hh_head = (__ptr->hh).hh_next;
      }
      pUVar7 = (__ptr->hh).hh_prev;
      pUVar8 = (__ptr->hh).hh_next;
      if (pUVar7 != (UT_hash_handle *)0x0) {
        pUVar7->hh_next = pUVar8;
      }
      if (pUVar8 != (UT_hash_handle *)0x0) {
        pUVar8->hh_prev = pUVar7;
      }
      pUVar3->num_items = pUVar3->num_items - 1;
      pkVar10 = pkVar11;
    }
    free(__ptr);
    __ptr = pkVar2;
  }
  return;
}

Assistant:

void
ktxHashList_Destruct(ktxHashList* pHead)
{
    ktxKVListEntry* kv;
    ktxKVListEntry* head = *pHead;

    for(kv = head; kv != NULL;) {
        ktxKVListEntry* tmp = (ktxKVListEntry*)kv->hh.next;
        HASH_DELETE(hh, head, kv);
        free(kv);
        kv = tmp;
    }
}